

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O2

void __thiscall pstore::database::finish_init(database *this,bool access_tick_enabled)

{
  storage *addr;
  int iVar1;
  header *header;
  
  iVar1 = (*((this->storage_).file_.
             super___shared_ptr<pstore::file::file_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            _vptr_file_base[2])();
  if ((char)iVar1 != '\0') {
    addr = &this->storage_;
    storage::update_master_pointers(addr,0);
    trailer::validate(this,(typed_address<pstore::trailer>)(this->size_).footer_pos_.a_.a_);
    storage::protect(addr,(address)0x30,(address)(this->size_).logical_);
    storage::address_to_pointer<pstore::header>
              ((storage *)&stack0xffffffffffffffc8,(typed_address<pstore::header>)addr);
    std::__shared_ptr<pstore::header,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->header_).super___shared_ptr<pstore::header,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<pstore::header,_(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc8)
    ;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffd0);
    build_sync_name_abi_cxx11_
              ((string *)&stack0xffffffffffffffc8,
               (database *)
               (this->header_).super___shared_ptr<pstore::header,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               ,header);
    std::__cxx11::string::operator=((string *)&this->sync_name_,(string *)&stack0xffffffffffffffc8);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
    anon_unknown.dwarf_6a961::get_vacuum_range_lock
              ((range_lock *)&stack0xffffffffffffffc8,
               (this->storage_).file_.
               super___shared_ptr<pstore::file::file_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               shared_read);
    pstore::file::range_lock::operator=(&this->range_lock_,(range_lock *)&stack0xffffffffffffffc8);
    pstore::file::range_lock::~range_lock((range_lock *)&stack0xffffffffffffffc8);
    std::unique_lock<pstore::file::range_lock>::unique_lock
              ((unique_lock<pstore::file::range_lock> *)&stack0xffffffffffffffc8,&this->range_lock_)
    ;
    std::unique_lock<pstore::file::range_lock>::operator=
              (&this->lock_,(unique_lock<pstore::file::range_lock> *)&stack0xffffffffffffffc8);
    std::unique_lock<pstore::file::range_lock>::~unique_lock
              ((unique_lock<pstore::file::range_lock> *)&stack0xffffffffffffffc8);
    return;
  }
  assert_failed("file ()->is_open ()",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/database.cpp"
                ,0x46);
}

Assistant:

void database::finish_init (bool const access_tick_enabled) {
        (void) access_tick_enabled;

        PSTORE_ASSERT (file ()->is_open ());

        // Build the initial segment address table.
        storage_.update_master_pointers (0);

        trailer::validate (*this, size_.footer_pos ());
        this->protect (address{sizeof (header)}, address{size_.logical_size ()});

        header_ = storage_.address_to_pointer (typed_address<header>::null ());
        sync_name_ = database::build_sync_name (*header_);

        // Put a shared-read lock on the lock_block strcut in the file. We're not going to modify
        // these bytes.
        range_lock_ =
            get_vacuum_range_lock (this->file (), file::file_handle::lock_kind::shared_read);
        lock_ = std::unique_lock<file::range_lock> (range_lock_);
    }